

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

Image * GenImageChecked(Image *__return_storage_ptr__,int width,int height,int checksX,int checksY,
                       Color col1,Color col2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Color CVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  pvVar4 = malloc((long)(height * width) << 2);
  auVar2 = _DAT_00163250;
  auVar1 = _DAT_0015d7b0;
  if (0 < height) {
    lVar5 = (ulong)(uint)width - 1;
    auVar9._8_4_ = (int)lVar5;
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = (long)pvVar4 + 4;
    uVar6 = 0;
    auVar9 = auVar9 ^ _DAT_0015d7b0;
    do {
      if (0 < width) {
        uVar8 = 0;
        auVar10 = auVar2;
        do {
          auVar12 = auVar10 ^ auVar1;
          iVar7 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                       (long)checksY);
          if ((bool)(~(auVar9._4_4_ < auVar12._4_4_ ||
                      auVar9._0_4_ < auVar12._0_4_ && auVar12._4_4_ == auVar9._4_4_) & 1)) {
            CVar3 = col2;
            if (((int)((long)((ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff) /
                      (long)checksX) + iVar7 & 1U) == 0) {
              CVar3 = col1;
            }
            *(Color *)(lVar5 + -4 + uVar8 * 4) = CVar3;
          }
          if (auVar12._12_4_ <= auVar9._12_4_ &&
              (auVar12._8_4_ <= auVar9._8_4_ || auVar12._12_4_ != auVar9._12_4_)) {
            CVar3 = col2;
            if ((((int)uVar8 + 1) / checksX + iVar7 & 1U) == 0) {
              CVar3 = col1;
            }
            *(Color *)(lVar5 + uVar8 * 4) = CVar3;
          }
          uVar8 = uVar8 + 2;
          lVar11 = auVar10._8_8_;
          auVar10._0_8_ = auVar10._0_8_ + 2;
          auVar10._8_8_ = lVar11 + 2;
        } while ((width + 1U & 0xfffffffe) != uVar8);
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + (ulong)(uint)width * 4;
    } while (uVar6 != (uint)height);
  }
  __return_storage_ptr__->data = pvVar4;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageChecked(int width, int height, int checksX, int checksY, Color col1, Color col2)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    for (int y = 0; y < height; y++)
    {
        for (int x = 0; x < width; x++)
        {
            if ((x/checksX + y/checksY)%2 == 0) pixels[y*width + x] = col1;
            else pixels[y*width + x] = col2;
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}